

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

fitsfile *
ffhist3(fitsfile *fptr,char *outfile,int imagetype,int naxis,char (*colname) [71],double *minin,
       double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
       char (*binname) [71],double weightin,char *wtcol,int recip,char *selectrow,int *status)

{
  double dVar1;
  int iVar2;
  int iStack_100;
  fitsfile *histptr;
  double weight;
  int wtcolnum;
  int colnum [4];
  long haxes [4];
  double binsize [4];
  double amax [4];
  double amin [4];
  
  if (0 < *status) {
    return (fitsfile *)0x0;
  }
  if (4 < naxis) {
    ffpmsg("histogram has more than 4 dimensions");
    *status = 0x140;
    return (fitsfile *)0x0;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (imagetype == 0xb) {
    iStack_100 = 8;
  }
  else if (imagetype == 0x52) {
    iStack_100 = -0x40;
  }
  else if (imagetype == 0x1f) {
    iStack_100 = 0x20;
  }
  else if (imagetype == 0x2a) {
    iStack_100 = -0x20;
  }
  else {
    if (imagetype != 0x15) {
      *status = 0x19a;
      return (fitsfile *)0x0;
    }
    iStack_100 = 0x10;
  }
  iVar2 = fits_calc_binningd(fptr,naxis,colname,minin,maxin,binsizein,minname,maxname,binname,colnum
                             ,haxes,amin,amax,binsize,status);
  if (iVar2 < 1) {
    dVar1 = weightin;
    if ((*wtcol == '\0') ||
       (iVar2 = ffgky(fptr,0x52,wtcol,&weight,(char *)0x0,status), dVar1 = weight, iVar2 == 0)) {
      weight = dVar1;
      if ((weight <= 0.0) && ((weight != -9.1191291391491e-36 || (NAN(weight))))) {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
        *status = 0x7d;
        return (fitsfile *)0x0;
      }
      if ((recip != 0) && ((weight != -9.1191291391491e-36 || (NAN(weight))))) {
        weight = 1.0 / weight;
      }
    }
    else {
      *status = 0;
      iVar2 = ffgcno(fptr,0,wtcol,&wtcolnum,status);
      if (0 < iVar2) {
        ffpmsg("keyword or column for histogram weights doesn\'t exist: ");
        goto LAB_00171813;
      }
      weight = -9.1191291391491e-36;
    }
    iVar2 = ffinit(&histptr,outfile,status);
    if (iVar2 < 1) {
      iVar2 = ffcrim(histptr,iStack_100,naxis,haxes,status);
      if (iVar2 < 1) {
        iVar2 = fits_copy_pixlist2image(fptr,histptr,9,naxis,colnum,status);
        if (iVar2 < 1) {
          fits_write_keys_histo(fptr,histptr,naxis,colnum,status);
          fits_rebin_wcsd(histptr,naxis,amin,binsize,status);
          iVar2 = fits_make_histd(fptr,histptr,iStack_100,naxis,haxes,colnum,amin,amax,binsize,
                                  weight,wtcolnum,recip,selectrow,status);
          if (iVar2 < 1) {
            return histptr;
          }
          wtcol = "failed to calculate new histogram values";
        }
        else {
          wtcol = "failed to copy pixel list keywords to new histogram header";
        }
      }
      else {
        wtcol = "failed to create output histogram FITS image";
      }
    }
    else {
      wtcol = "failed to create temp output file for histogram";
    }
  }
  else {
    wtcol = "failed to determine binning parameters";
  }
LAB_00171813:
  ffpmsg(wtcol);
  return (fitsfile *)0x0;
}

Assistant:

fitsfile *ffhist3(fitsfile *fptr, /* I - ptr to table with X and Y cols*/
           char *outfile,    /* I - name for the output histogram file      */
           int imagetype,    /* I - datatype for image: TINT, TSHORT, etc   */
           int naxis,        /* I - number of axes in the histogram image   */
           char colname[4][FLEN_VALUE],   /* I - column names               */
           double *minin,     /* I - minimum histogram value, for each axis */
           double *maxin,     /* I - maximum histogram value, for each axis */
           double *binsizein, /* I - bin size along each axis               */
           char minname[4][FLEN_VALUE], /* I - optional keywords for min    */
           char maxname[4][FLEN_VALUE], /* I - optional keywords for max    */
           char binname[4][FLEN_VALUE], /* I - optional keywords for binsize */
           double weightin,        /* I - binning weighting factor          */
           char wtcol[FLEN_VALUE], /* I - optional keyword or col for weight*/
           int recip,              /* I - use reciprocal of the weight?     */
           char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
           int *status)
{
    fitsfile *histptr;
    int   bitpix, colnum[4], wtcolnum;
    long haxes[4];
    double amin[4], amax[4], binsize[4],  weight;

    if (*status > 0)
        return(NULL);

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
	*status = BAD_DIMEN;
        return(NULL);
    }

    /* reset position to the correct HDU if necessary */
    if ((fptr)->HDUposition != ((fptr)->Fptr)->curhdu)
        ffmahd(fptr, ((fptr)->HDUposition) + 1, NULL, status);

    if (imagetype == TBYTE)
        bitpix = BYTE_IMG;
    else if (imagetype == TSHORT)
        bitpix = SHORT_IMG;
    else if (imagetype == TINT)
        bitpix = LONG_IMG;
    else if (imagetype == TFLOAT)
        bitpix = FLOAT_IMG;
    else if (imagetype == TDOUBLE)
        bitpix = DOUBLE_IMG;
    else{
        *status = BAD_DATATYPE;
        return(NULL);
    }
    
    /*    Calculate the binning parameters:    */
    /*   columm numbers, axes length, min values,  max values, and binsizes.  */

    if (fits_calc_binningd(
      fptr, naxis, colname, minin, maxin, binsizein, minname, maxname, binname,
      colnum, haxes, amin, amax, binsize, status) > 0)
    {
       ffpmsg("failed to determine binning parameters");
        return(NULL);
    }
 
    /* get the histogramming weighting factor, if any */
    if (*wtcol)
    {
        /* first, look for a keyword with the weight value */
        if (fits_read_key(fptr, TDOUBLE, wtcol, &weight, NULL, status) )
        {
            /* not a keyword, so look for column with this name */
            *status = 0;

            /* get the column number in the table */
            if (ffgcno(fptr, CASEINSEN, wtcol, &wtcolnum, status) > 0)
            {
               ffpmsg(
               "keyword or column for histogram weights doesn't exist: ");
               ffpmsg(wtcol);
               return(NULL);
            }

            weight = DOUBLENULLVALUE;
        }
    }
    else
        weight = (double) weightin;

    if (weight <= 0. && weight != DOUBLENULLVALUE)
    {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
	*status = URL_PARSE_ERROR;
        return(NULL);
    }

    if (recip && weight != DOUBLENULLVALUE)
       /* take reciprocal of weight */
       weight = (double) (1.0 / weight);

    /* size of histogram is now known, so create temp output file */
    if (fits_create_file(&histptr, outfile, status) > 0)
    {
        ffpmsg("failed to create temp output file for histogram");
        return(NULL);
    }

    /* create output FITS image HDU */
    if (ffcrim(histptr, bitpix, naxis, haxes, status) > 0)
    {
        ffpmsg("failed to create output histogram FITS image");
        return(NULL);
    }

    /* copy header keywords, converting pixel list WCS keywords to image WCS */
    if (fits_copy_pixlist2image(fptr, histptr, 9, naxis, colnum, status) > 0)
    {
        ffpmsg("failed to copy pixel list keywords to new histogram header");
        return(NULL);
    }

    /* if the table columns have no WCS keywords, then write default keywords */
    fits_write_keys_histo(fptr, histptr, naxis, colnum, status);
    
    /* update the WCS keywords for the ref. pixel location, and pixel size */
    fits_rebin_wcsd(histptr, naxis, amin, binsize,  status);      
    
    /* now compute the output image by binning the column values */
    if (fits_make_histd(fptr, histptr, bitpix, naxis, haxes, colnum, amin, amax,
        binsize, weight, wtcolnum, recip, selectrow, status) > 0)
    {
        ffpmsg("failed to calculate new histogram values");
        return(NULL);
    }
              
    return(histptr);
}